

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O2

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::pushNode(OpenGEXImporter *this,aiNode *node,aiScene *pScene)

{
  pointer ppaVar1;
  aiNode *paVar2;
  iterator iVar3;
  _Head_base<0UL,_Assimp::OpenGEX::OpenGEXImporter::ChildInfo_*,_false> __p;
  __uniq_ptr_impl<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>
  *this_00;
  __uniq_ptr_impl<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>
  local_30;
  aiNode *node_local;
  
  node_local = node;
  if (pScene == (aiScene *)0x0) {
    __assert_fail("nullptr != pScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                  ,0x4ed,"void Assimp::OpenGEX::OpenGEXImporter::pushNode(aiNode *, aiScene *)");
  }
  if (node == (aiNode *)0x0) {
    return;
  }
  ppaVar1 = (this->m_nodeStack).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((this->m_nodeStack).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_start == ppaVar1) {
    node->mParent = pScene->mRootNode;
    iVar3 = std::
            _Rb_tree<aiNode_*,_std::pair<aiNode_*const,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>_>,_std::_Select1st<std::pair<aiNode_*const,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>_>_>,_std::less<aiNode_*>,_std::allocator<std::pair<aiNode_*const,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>_>_>_>
            ::find(&(this->m_nodeChildMap)._M_t,&node->mParent);
    if (&(this->m_nodeChildMap)._M_t._M_impl.super__Rb_tree_header ==
        (_Rb_tree_header *)iVar3._M_node) {
      __p._M_head_impl = (ChildInfo *)operator_new(0x18);
      ((__p._M_head_impl)->m_children).super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl
      ._M_node.super__List_node_base._M_prev = (_List_node_base *)__p._M_head_impl;
      ((__p._M_head_impl)->m_children).super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl
      ._M_node.super__List_node_base._M_next = (_List_node_base *)__p._M_head_impl;
      ((__p._M_head_impl)->m_children).super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl
      ._M_node._M_size = 0;
      this->m_root = __p._M_head_impl;
      local_30._M_t.
      super__Tuple_impl<0UL,_Assimp::OpenGEX::OpenGEXImporter::ChildInfo_*,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>
      .super__Head_base<0UL,_Assimp::OpenGEX::OpenGEXImporter::ChildInfo_*,_false>._M_head_impl =
           (tuple<Assimp::OpenGEX::OpenGEXImporter::ChildInfo_*,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>
            )(tuple<Assimp::OpenGEX::OpenGEXImporter::ChildInfo_*,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>
              )__p._M_head_impl;
      this_00 = (__uniq_ptr_impl<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>
                 *)std::
                   map<aiNode_*,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>,_std::less<aiNode_*>,_std::allocator<std::pair<aiNode_*const,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>_>_>_>
                   ::operator[](&this->m_nodeChildMap,&node->mParent);
      goto LAB_00469891;
    }
  }
  else {
    paVar2 = ppaVar1[-1];
    if (paVar2 == (aiNode *)0x0) {
      __assert_fail("nullptr != parent",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                    ,0x501,"void Assimp::OpenGEX::OpenGEXImporter::pushNode(aiNode *, aiScene *)");
    }
    node->mParent = paVar2;
    iVar3 = std::
            _Rb_tree<aiNode_*,_std::pair<aiNode_*const,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>_>,_std::_Select1st<std::pair<aiNode_*const,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>_>_>,_std::less<aiNode_*>,_std::allocator<std::pair<aiNode_*const,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>_>_>_>
            ::find(&(this->m_nodeChildMap)._M_t,&node->mParent);
    if (&(this->m_nodeChildMap)._M_t._M_impl.super__Rb_tree_header ==
        (_Rb_tree_header *)iVar3._M_node) {
      __p._M_head_impl = (ChildInfo *)operator_new(0x18);
      ((__p._M_head_impl)->m_children).super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl
      ._M_node.super__List_node_base._M_prev = (_List_node_base *)__p._M_head_impl;
      ((__p._M_head_impl)->m_children).super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl
      ._M_node.super__List_node_base._M_next = (_List_node_base *)__p._M_head_impl;
      ((__p._M_head_impl)->m_children).super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl
      ._M_node._M_size = 0;
      local_30._M_t.
      super__Tuple_impl<0UL,_Assimp::OpenGEX::OpenGEXImporter::ChildInfo_*,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>
      .super__Head_base<0UL,_Assimp::OpenGEX::OpenGEXImporter::ChildInfo_*,_false>._M_head_impl =
           (tuple<Assimp::OpenGEX::OpenGEXImporter::ChildInfo_*,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>
            )(tuple<Assimp::OpenGEX::OpenGEXImporter::ChildInfo_*,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>
              )__p._M_head_impl;
      this_00 = (__uniq_ptr_impl<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>
                 *)std::
                   map<aiNode_*,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>,_std::less<aiNode_*>,_std::allocator<std::pair<aiNode_*const,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>_>_>_>
                   ::operator[](&this->m_nodeChildMap,&node->mParent);
LAB_00469891:
      local_30._M_t.
      super__Tuple_impl<0UL,_Assimp::OpenGEX::OpenGEXImporter::ChildInfo_*,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>
      .super__Head_base<0UL,_Assimp::OpenGEX::OpenGEXImporter::ChildInfo_*,_false>._M_head_impl =
           (tuple<Assimp::OpenGEX::OpenGEXImporter::ChildInfo_*,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>
            )(_Tuple_impl<0UL,_Assimp::OpenGEX::OpenGEXImporter::ChildInfo_*,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>
              )0x0;
      std::
      __uniq_ptr_impl<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>
      ::reset(this_00,__p._M_head_impl);
      std::
      unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>
      ::~unique_ptr((unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>
                     *)&local_30);
      goto LAB_004698ad;
    }
  }
  __p._M_head_impl = (ChildInfo *)iVar3._M_node[1]._M_parent;
LAB_004698ad:
  std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::push_back
            (&(__p._M_head_impl)->m_children,&node_local);
  std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back(&this->m_nodeStack,&node_local);
  return;
}

Assistant:

void OpenGEXImporter::pushNode( aiNode *node, aiScene *pScene ) {
    ai_assert( nullptr != pScene );

    if ( nullptr == node ) {
        return;
    }

    ChildInfo *info( nullptr );
    if( m_nodeStack.empty() ) {
        node->mParent = pScene->mRootNode;
        NodeChildMap::iterator it( m_nodeChildMap.find( node->mParent ) );
        if( m_nodeChildMap.end() == it ) {
            info = new ChildInfo;
            m_root = info;
            m_nodeChildMap[ node->mParent ] = std::unique_ptr<ChildInfo>(info);
        } else {
            info = it->second.get();
        }
        info->m_children.push_back( node );
    } else {
        aiNode *parent( m_nodeStack.back() );
        ai_assert( nullptr != parent );
        node->mParent = parent;
        NodeChildMap::iterator it( m_nodeChildMap.find( node->mParent ) );
        if( m_nodeChildMap.end() == it ) {
            info = new ChildInfo;
            m_nodeChildMap[ node->mParent ] = std::unique_ptr<ChildInfo>(info);
        } else {
            info = it->second.get();
        }
        info->m_children.push_back( node );
    }
    m_nodeStack.push_back( node );
}